

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFMovem<(moira::Instr)193,(moira::Mode)1,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  An an;
  Dn dn;
  Dn dn_00;
  FRegList FVar11;
  Moira *this_00;
  byte bVar12;
  uint ext;
  Fctrl fctrl;
  char **ppcVar13;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  this_00 = this;
  uVar5 = (*this->_vptr_Moira[6])();
  ext = uVar5 & 0xffff;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (bVar4 = isValidExtFPU(this_00,FMOVEM,AN,op,ext), !bVar4)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)193,(moira::Mode)1,0>(this,str,addr,op);
    return;
  }
  if (3 < (ext >> 0xd) - 4) {
    return;
  }
  an.raw = op & 7;
  uVar9 = ext >> 0xb & 3;
  bVar12 = (byte)ext >> 4 & 7;
  fctrl.raw = ext >> 10 & 7;
  switch(ext >> 0xd) {
  case 4:
    if (((uVar5 & 0x1c00) == 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovel"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
      }
      StrWriter::operator<<(str,an);
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ',';
      SVar2 = str->style->syntax;
      if (MUSASHI < SVar2) {
        return;
      }
      if ((0x13U >> (SVar2 & 0x1f) & 1) == 0) {
        return;
      }
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
      return;
    }
    if (((uint)fctrl.raw < 5) && (fctrl.raw != 3)) {
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmove"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      StrWriter::operator<<(str,(Ffmt)0x0);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
        goto LAB_002a2aec;
      }
    }
    else {
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x0);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
        goto LAB_002a2aec;
      }
    }
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
LAB_002a2aec:
    StrWriter::operator<<(str,an);
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    StrWriter::operator<<(str,fctrl);
    return;
  case 5:
    if (((uVar5 & 0x1c00) == 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmove"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      StrWriter::operator<<(str,(Ffmt)0x0);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
      }
    }
    else {
      if (((uint)fctrl.raw < 5) && (fctrl.raw != 3)) {
        cVar8 = 'f';
        lVar6 = 1;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = cVar8;
          cVar8 = "fmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
        StrWriter::operator<<(str,(Ffmt)0x0);
        if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
LAB_002a2ab8:
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        }
        else {
          iVar3 = (str->tab).raw;
          do {
            pcVar7 = str->ptr;
            str->ptr = pcVar7 + 1;
            *pcVar7 = ' ';
          } while (str->ptr < str->base + iVar3);
        }
      }
      else {
        cVar8 = 'f';
        lVar6 = 1;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = cVar8;
          cVar8 = "fmovem"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
        StrWriter::operator<<(str,(Ffmt)0x0);
        if ((str->style->syntax & ~MOIRA_MIT) == GNU) goto LAB_002a2ab8;
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
      }
      StrWriter::operator<<(str,fctrl);
    }
    goto LAB_002a3159;
  case 6:
    switch(uVar9) {
    case 0:
      ppcVar13 = &str->ptr;
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
      }
      StrWriter::operator<<(str,an);
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ',';
      SVar2 = str->style->syntax;
      if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      FVar11.raw = (u16)(uVar5 & 0xff);
      if ((uVar5 & 0xff) == 0) {
LAB_002a3013:
        ppcVar13 = &str->ptr;
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = '#';
        sprintd(ppcVar13,0);
        return;
      }
      goto LAB_002a3000;
    case 1:
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
        goto LAB_002a3058;
      }
      break;
    case 2:
      ppcVar13 = &str->ptr;
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
      }
      StrWriter::operator<<(str,an);
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ',';
      SVar2 = str->style->syntax;
      if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      if ((uVar5 & 0xff) == 0) goto LAB_002a3013;
      uVar10 = (ulong)(uVar5 & 0xff) * 0x202020202 & 0x10884422010;
      FVar11.raw = (short)(uVar10 / 0x3ff) + (short)uVar10 & 0xff;
LAB_002a3000:
      StrWriter::operator<<(str,FVar11);
      return;
    case 3:
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar3);
        goto LAB_002a3058;
      }
    }
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
LAB_002a3058:
    StrWriter::operator<<(str,an);
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    dn.raw._1_3_ = 0;
    dn.raw._0_1_ = bVar12;
    StrWriter::operator<<(str,dn);
    return;
  }
  switch(uVar9) {
  case 0:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar3 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar3);
    }
    FVar11.raw = (u16)(uVar5 & 0xff);
    if ((uVar5 & 0xff) != 0) goto LAB_002a30df;
LAB_002a30e6:
    ppcVar13 = &str->ptr;
    pcVar7 = *ppcVar13;
    *ppcVar13 = pcVar7 + 1;
    *pcVar7 = '#';
    sprintd(ppcVar13,0);
    break;
  case 1:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
LAB_002a2da3:
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar3 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar3);
    }
    goto LAB_002a314d;
  case 2:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar3 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar3);
    }
    if ((uVar5 & 0xff) == 0) goto LAB_002a30e6;
    uVar10 = (ulong)(uVar5 & 0xff) * 0x202020202 & 0x10884422010;
    FVar11.raw = (short)(uVar10 / 0x3ff) + (short)uVar10 & 0xff;
LAB_002a30df:
    StrWriter::operator<<(str,FVar11);
    break;
  case 3:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) goto LAB_002a2da3;
    iVar3 = (str->tab).raw;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    } while (str->ptr < str->base + iVar3);
LAB_002a314d:
    dn_00.raw._1_3_ = 0;
    dn_00.raw._0_1_ = bVar12;
    StrWriter::operator<<(str,dn_00);
LAB_002a3159:
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar2 = str->style->syntax;
    if ((MUSASHI < SVar2) || ((0x13U >> (SVar2 & 0x1f) & 1) == 0)) goto LAB_002a318c;
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    goto LAB_002a3189;
  }
  ppcVar13 = &str->ptr;
  pcVar7 = *ppcVar13;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar7 = *ppcVar13;
    *ppcVar13 = pcVar7 + 1;
LAB_002a3189:
    *pcVar7 = ' ';
  }
LAB_002a318c:
  StrWriter::operator<<(str,an);
  return;
}

Assistant:

void
Moira::dasmFMovem(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto mod = ___xx___________ (ext);
    auto rrr = _________xxx____ (ext);
    auto lll = ___xxx__________ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b100: // Ea to Cntrl

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << "fmovel" << str.tab << Op<M, Long>(reg, addr) << Sep{};
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Op<M, Long>(reg, addr) << Sep{} << Fctrl{lll};
            break;

        case 0b101: // Cntrl to Ea

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab << Sep{} << Op<M, Long>(reg, addr);
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Fctrl{lll} << Sep{} << Op<M, Long>(reg, addr);
            break;

        case 0b110: // Memory to FPU

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF));
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;
            }
            break;

        case 0b111: // FPU to memory

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF)) ;
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}